

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O3

void mbedtls_debug_print_mpi
               (mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,mbedtls_mpi *X)

{
  bool bVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  uint uVar9;
  bool bVar10;
  char str [512];
  char local_238 [520];
  
  if ((((ssl->conf != (mbedtls_ssl_config *)0x0) && (X != (mbedtls_mpi *)0x0)) &&
      (ssl->conf->f_dbg != (_func_void_void_ptr_int_char_ptr_int_char_ptr *)0x0)) &&
     (level <= debug_threshold)) {
    iVar3 = (int)X->n * 0x40 + 1;
    sVar2 = X->n;
    do {
      sVar8 = sVar2;
      if (sVar8 == 1) {
        uVar4 = *X->p;
        iVar3 = 1;
        break;
      }
      uVar4 = X->p[sVar8 - 1];
      iVar3 = iVar3 + -0x40;
      sVar2 = sVar8 - 1;
    } while (uVar4 == 0);
    uVar5 = 0x3f;
    do {
      if ((uVar4 >> (uVar5 & 0x3f) & 1) != 0) goto LAB_00118e82;
      bVar10 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar10);
    uVar5 = 0xffffffff;
LAB_00118e82:
    snprintf(local_238,0x200,"value of \'%s\' (%d bits) is:\n",text,
             (ulong)(uint)(iVar3 + (int)uVar5));
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_238);
    if (sVar8 == 0) {
      lVar7 = 0;
    }
    else {
      bVar10 = true;
      lVar7 = 0;
      uVar9 = 0;
      do {
        while (sVar8 = sVar8 - 1, !bVar10) {
LAB_00118f05:
          lVar6 = 0x38;
          do {
            if ((bVar10) && ((char)(X->p[sVar8] >> ((byte)lVar6 & 0x3f)) == '\0')) {
              bVar10 = true;
              bVar1 = true;
            }
            else {
              if (0 < (int)uVar9 && (uVar9 & 0xf) == 0) {
                snprintf(local_238 + lVar7,0x200 - lVar7,anon_var_dwarf_30aa7 + 8);
                (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_238);
                lVar7 = 0;
              }
              bVar1 = false;
              iVar3 = snprintf(local_238 + lVar7,0x200 - lVar7," %02x",
                               X->p[sVar8] >> ((byte)lVar6 & 0x3f) & 0xff);
              lVar7 = lVar7 + iVar3;
              uVar9 = uVar9 + 1;
              bVar10 = false;
            }
            lVar6 = lVar6 + -8;
          } while (lVar6 != -8);
          if (sVar8 == 0) {
            if (!bVar1) goto LAB_0011900b;
            goto LAB_00118fea;
          }
        }
        if (X->p[sVar8] != 0) {
          bVar10 = true;
          goto LAB_00118f05;
        }
        bVar10 = true;
      } while (sVar8 != 0);
    }
LAB_00118fea:
    iVar3 = snprintf(local_238 + lVar7,0x200 - lVar7," 00");
    lVar7 = lVar7 + iVar3;
LAB_0011900b:
    snprintf(local_238 + lVar7,0x200 - lVar7,anon_var_dwarf_30aa7 + 8);
    (*ssl->conf->f_dbg)(ssl->conf->p_dbg,level,file,line,local_238);
  }
  return;
}

Assistant:

void mbedtls_debug_print_mpi( const mbedtls_ssl_context *ssl, int level,
                      const char *file, int line,
                      const char *text, const mbedtls_mpi *X )
{
    char str[DEBUG_BUF_SIZE];
    int j, k, zeros = 1;
    size_t i, n, idx = 0;

    if( ssl->conf == NULL || ssl->conf->f_dbg == NULL || X == NULL || level > debug_threshold )
        return;

    for( n = X->n - 1; n > 0; n-- )
        if( X->p[n] != 0 )
            break;

    for( j = ( sizeof(mbedtls_mpi_uint) << 3 ) - 1; j >= 0; j-- )
        if( ( ( X->p[n] >> j ) & 1 ) != 0 )
            break;

    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "value of '%s' (%d bits) is:\n",
              text, (int) ( ( n * ( sizeof(mbedtls_mpi_uint) << 3 ) ) + j + 1 ) );

    debug_send_line( ssl, level, file, line, str );

    idx = 0;
    for( i = n + 1, j = 0; i > 0; i-- )
    {
        if( zeros && X->p[i - 1] == 0 )
            continue;

        for( k = sizeof( mbedtls_mpi_uint ) - 1; k >= 0; k-- )
        {
            if( zeros && ( ( X->p[i - 1] >> ( k << 3 ) ) & 0xFF ) == 0 )
                continue;
            else
                zeros = 0;

            if( j % 16 == 0 )
            {
                if( j > 0 )
                {
                    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "\n" );
                    debug_send_line( ssl, level, file, line, str );
                    idx = 0;
                }
            }

            idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, " %02x", (unsigned int)
                             ( X->p[i - 1] >> ( k << 3 ) ) & 0xFF );

            j++;
        }

    }

    if( zeros == 1 )
        idx += mbedtls_snprintf( str + idx, sizeof( str ) - idx, " 00" );

    mbedtls_snprintf( str + idx, sizeof( str ) - idx, "\n" );
    debug_send_line( ssl, level, file, line, str );
}